

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O0

RK_S32 trie_get_node(MppTrieImpl *trie,RK_S32 prev,RK_U64 key)

{
  int iVar1;
  uint uVar2;
  MppTrieNode *pMVar3;
  RK_S32 local_4c;
  MppTrieNode *n;
  RK_S32 idx;
  MppTrieNode *new_nodes;
  RK_S32 new_count;
  RK_S32 old_count;
  RK_U64 key_local;
  RK_S32 prev_local;
  MppTrieImpl *trie_local;
  
  if (trie->node_count <= trie->node_used) {
    iVar1 = trie->node_count;
    uVar2 = iVar1 << 1;
    pMVar3 = (MppTrieNode *)mpp_osal_realloc("trie_get_node",trie->nodes,(long)(int)uVar2 * 0x38);
    if (pMVar3 == (MppTrieNode *)0x0) {
      _mpp_log_l(2,"mpp_trie","failed to realloc new nodes %d\n","trie_get_node",(ulong)uVar2);
      return -1;
    }
    memset(pMVar3 + iVar1,0,(long)iVar1 * 0x38);
    if ((mpp_trie_debug & 8) != 0) {
      _mpp_log_l(4,"mpp_trie","trie %p enlarge node %p:%d -> %p:%d\n","trie_get_node",trie,
                 trie->nodes,trie->node_count,pMVar3,uVar2);
    }
    trie->nodes = pMVar3;
    trie->node_count = uVar2;
  }
  uVar2 = trie->node_used;
  trie->node_used = uVar2 + 1;
  pMVar3 = trie->nodes;
  pMVar3[(int)uVar2].idx = (RK_S16)uVar2;
  local_4c = prev;
  if (prev < 1) {
    local_4c = 0;
  }
  pMVar3[(int)uVar2].prev = (RK_S16)local_4c;
  pMVar3[(int)uVar2].key = (RK_U16)key;
  pMVar3[(int)uVar2].id = -1;
  if (-1 < prev) {
    trie->nodes[prev].next_cnt = trie->nodes[prev].next_cnt + 1;
  }
  if ((mpp_trie_debug & 8) != 0) {
    _mpp_log_l(4,"mpp_trie","get node %d\n","trie_get_node",(ulong)uVar2);
  }
  return uVar2;
}

Assistant:

static RK_S32 trie_get_node(MppTrieImpl *trie, RK_S32 prev, RK_U64 key)
{
    if (trie->node_used >= trie->node_count) {
        RK_S32 old_count = trie->node_count;
        RK_S32 new_count = old_count * 2;
        MppTrieNode *new_nodes = mpp_realloc(trie->nodes, MppTrieNode, new_count);

        if (!new_nodes) {
            mpp_err_f("failed to realloc new nodes %d\n", new_count);
            return -1;
        }

        /* NOTE: new memory should be memset to zero */
        memset(new_nodes + old_count, 0, sizeof(*new_nodes) * old_count);

        trie_dbg_cnt("trie %p enlarge node %p:%d -> %p:%d\n",
                     trie, trie->nodes, trie->node_count, new_nodes, new_count);

        trie->nodes = new_nodes;
        trie->node_count = new_count;
    }

    RK_S32 idx = trie->node_used++;
    MppTrieNode *n = &trie->nodes[idx];

    n->idx = idx;
    n->prev = (prev > 0) ? prev : 0;
    n->key = key;
    n->id = INVALID_NODE_ID;

    if (prev >= 0)
        trie->nodes[prev].next_cnt++;

    trie_dbg_cnt("get node %d\n", idx);

    return idx;
}